

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_decimal_result<char32_t_*> __thiscall
fmt::v8::detail::format_decimal<char32_t,unsigned__int128>
          (detail *this,char32_t *out,unsigned___int128 value,int size)

{
  format_decimal_result<char32_t_*> fVar1;
  int iVar2;
  size_t value_00;
  char *pcVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  undefined1 auVar4 [16];
  undefined8 in_stack_ffffffffffffff48;
  detail *pdVar5;
  undefined8 in_stack_ffffffffffffff50;
  char32_t *end;
  int iStack_68;
  int size_local;
  unsigned___int128 value_local;
  detail *local_50;
  char32_t *out_local;
  detail *local_38;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,size);
  auVar4._8_8_ = in_stack_ffffffffffffff50;
  auVar4._0_8_ = in_stack_ffffffffffffff48;
  iVar2 = count_digits((detail *)out,(uint128_t)auVar4);
  if (iVar2 <= in_ECX) {
    _iStack_68 = out;
    local_50 = this + (long)in_ECX * 4;
    while ((_iStack_68 < (char32_t *)0x64) <= (ulong)value_local) {
      local_50 = local_50 + -8;
      pdVar5 = local_50;
      value_00 = __umodti3(_iStack_68,(ulong)value_local);
      pcVar3 = digits2(value_00);
      *(int *)pdVar5 = (int)*pcVar3;
      *(int *)(pdVar5 + 4) = (int)pcVar3[1];
      auVar4 = __udivti3(_iStack_68,(ulong)value_local,100,0);
      value_local._0_8_ = auVar4._8_8_;
      _iStack_68 = auVar4._0_8_;
    }
    if ((ulong)value_local == 0 && (ulong)((char32_t *)0x9 < _iStack_68) <= -(ulong)value_local) {
      local_38 = local_50 + -4;
      *(int *)(local_50 + -4) = iStack_68 + 0x30;
    }
    else {
      local_38 = local_50 + -8;
      pdVar5 = local_38;
      pcVar3 = digits2((size_t)_iStack_68);
      *(int *)pdVar5 = (int)*pcVar3;
      *(int *)(pdVar5 + 4) = (int)pcVar3[1];
    }
    fVar1.end = (char32_t *)(this + (long)in_ECX * 4);
    fVar1.begin = (char32_t *)local_38;
    return fVar1;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}